

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.cpp
# Opt level: O2

void cashew::dump(char *str,Ref node,bool pretty)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,str);
  std::operator<<(poVar1,": ");
  if ((node.inst == (Value *)0x0) || ((node.inst)->type == Null)) {
    std::operator<<((ostream *)&std::cerr,"(nullptr)");
  }
  else {
    Value::stringify(node.inst,(ostream *)&std::cerr,pretty);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  return;
}

Assistant:

void dump(const char* str, Ref node, bool pretty) {
  std::cerr << str << ": ";
  if (!!node) {
    node->stringify(std::cerr, pretty);
  } else {
    std::cerr << "(nullptr)";
  }
  std::cerr << std::endl;
}